

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
MyPlanner::MyPlanner
          (MyPlanner *this,string *lower_bound_str,string *base_lower_bound_str,
          string *upper_bound_str,string *base_upper_bound_str)

{
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  string *base_upper_bound_str_local;
  string *upper_bound_str_local;
  string *base_lower_bound_str_local;
  string *lower_bound_str_local;
  MyPlanner *this_local;
  
  local_30 = base_upper_bound_str;
  base_upper_bound_str_local = upper_bound_str;
  upper_bound_str_local = base_lower_bound_str;
  base_lower_bound_str_local = lower_bound_str;
  lower_bound_str_local = (string *)this;
  std::__cxx11::string::string(local_50,(string *)lower_bound_str);
  std::__cxx11::string::string(local_70,(string *)base_lower_bound_str);
  std::__cxx11::string::string(local_a0,(string *)upper_bound_str);
  std::__cxx11::string::string(local_c0,(string *)base_lower_bound_str);
  despot::Planner::Planner(&this->super_Planner,local_50,local_70,local_a0,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  *(undefined ***)this = &PTR__MyPlanner_00158cc8;
  return;
}

Assistant:

MyPlanner(string lower_bound_str,
			string base_lower_bound_str,
			string upper_bound_str,
			string base_upper_bound_str) : Planner(lower_bound_str,
				base_lower_bound_str,
				upper_bound_str,
				base_lower_bound_str) {
  }